

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mch.c
# Opt level: O0

uchar * mchalo(errcxdef *ctx,size_t siz,char *comment)

{
  uchar *puVar1;
  size_t in_RSI;
  uchar *ret;
  char *in_stack_ffffffffffffffd8;
  
  puVar1 = (uchar *)malloc(in_RSI);
  if (puVar1 != (uchar *)0x0) {
    return puVar1;
  }
  errsigf((errcxdef *)0x0,in_stack_ffffffffffffffd8,0);
}

Assistant:

uchar *mchalo(errcxdef *ctx, size_t siz, char *comment)
{
    uchar *ret;

    VARUSED(comment);
    IF_DEBUG(mchtotmem += siz;)

    ret = (uchar *)osmalloc(siz);
    if (ret)
        return(ret);
    else
    {
        errsig(ctx, ERR_NOMEM);
        NOTREACHEDV(uchar *);
        return 0;
    }
}